

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu540c_common.c
# Opt level: O0

MPP_RET vepu540c_set_roi(void *roi_reg_base,MppEncROICfg *roi,RK_S32 w,RK_S32 h)

{
  uint local_48;
  MPP_RET local_44;
  RK_S32 i;
  MPP_RET ret;
  Vepu540cRoiRegion *reg_regions;
  Vepu540cRoiCfg *roi_cfg;
  MppEncROIRegion *region;
  RK_S32 h_local;
  RK_S32 w_local;
  MppEncROICfg *roi_local;
  void *roi_reg_base_local;
  
  roi_cfg = (Vepu540cRoiCfg *)roi->regions;
  _i = (uint *)((long)roi_reg_base + 0x10);
  local_44 = MPP_NOK;
  memset(_i,0,0x80);
  if ((roi_reg_base == (void *)0x0) || (roi == (MppEncROICfg *)0x0)) {
    _mpp_log_l(2,"vepu540c_common","invalid buf %p roi %p\n","vepu540c_set_roi",roi_reg_base,roi);
  }
  else if (roi->number < 9) {
    local_44 = MPP_OK;
    for (local_48 = 0; (int)local_48 < (int)roi->number; local_48 = local_48 + 1) {
      if ((w < (int)((uint)*(ushort *)&roi_cfg->fmdc_adj0 + (uint)*(ushort *)&roi_cfg->fmdc_adj1))
         || (h < (int)((uint)*(ushort *)&(roi_cfg->fmdc_adj0).field_0x2 +
                      (uint)*(ushort *)&(roi_cfg->fmdc_adj1).field_0x2))) {
        local_44 = MPP_NOK;
      }
      if ((((1 < (ushort)roi_cfg->reserved_1058) || (7 < *(ushort *)&roi_cfg->bmap_cfg)) ||
          (1 < (byte)(roi_cfg->bmap_cfg).field_0x2)) || (1 < (byte)(roi_cfg->bmap_cfg).field_0x3)) {
        local_44 = MPP_NOK;
      }
      if ((((roi_cfg->bmap_cfg).field_0x3 != '\0') &&
          (0x33 < *(short *)((long)&roi_cfg->reserved_1058 + 2))) ||
         (((roi_cfg->bmap_cfg).field_0x3 == '\0' &&
          ((0x33 < *(short *)((long)&roi_cfg->reserved_1058 + 2) ||
           (*(short *)((long)&roi_cfg->reserved_1058 + 2) < -0x33)))))) {
        local_44 = MPP_NOK;
      }
      if (local_44 != MPP_OK) {
        _mpp_log_l(2,"vepu540c_common","region %d invalid param:\n","vepu540c_set_roi",
                   (ulong)local_48);
        _mpp_log_l(2,"vepu540c_common","position [%d:%d:%d:%d] vs [%d:%d]\n","vepu540c_set_roi",
                   (ulong)*(ushort *)&roi_cfg->fmdc_adj0,
                   (ulong)*(ushort *)&(roi_cfg->fmdc_adj0).field_0x2,
                   (uint)*(ushort *)&roi_cfg->fmdc_adj1,
                   (uint)*(ushort *)&(roi_cfg->fmdc_adj1).field_0x2,w,h);
        _mpp_log_l(2,"vepu540c_common","force intra %d qp area index %d\n","vepu540c_set_roi",
                   (ulong)(ushort)roi_cfg->reserved_1058,(ulong)*(ushort *)&roi_cfg->bmap_cfg);
        _mpp_log_l(2,"vepu540c_common","abs qp mode %d value %d\n","vepu540c_set_roi",
                   (ulong)(byte)(roi_cfg->bmap_cfg).field_0x3,
                   (ulong)(uint)(int)*(short *)((long)&roi_cfg->reserved_1058 + 2));
        return local_44;
      }
      *_i = *_i & 0xfffffc00 | (int)(*(ushort *)&roi_cfg->fmdc_adj0 + 0xf) >> 4 & 0x3ffU;
      *_i = *_i & 0xfc00ffff |
            ((int)(*(ushort *)&(roi_cfg->fmdc_adj0).field_0x2 + 0xf) >> 4 & 0x3ffU) << 0x10;
      _i[1] = _i[1] & 0xfffffc00 |
              (int)((uint)*(ushort *)&roi_cfg->fmdc_adj0 + (uint)*(ushort *)&roi_cfg->fmdc_adj1 +
                   0xf) >> 4 & 0x3ffU;
      _i[1] = _i[1] & 0xfc00ffff |
              ((int)((uint)*(ushort *)&(roi_cfg->fmdc_adj0).field_0x2 +
                     (uint)*(ushort *)&(roi_cfg->fmdc_adj1).field_0x2 + 0xf) >> 4 & 0x3ffU) << 0x10;
      _i[2] = _i[2] & 0xffffff80 | (int)*(short *)((long)&roi_cfg->reserved_1058 + 2) & 0x7fU;
      _i[2] = _i[2] & 0xffffff7f | ((byte)(roi_cfg->bmap_cfg).field_0x3 & 1) << 7;
      _i[2] = _i[2] & 0xffffdfff | 0x2000;
      _i[2] = _i[2] & 0xffffe0ff | 0x1f00;
      if ((short)roi_cfg->reserved_1058 != 0) {
        _i[3] = _i[3] & 0xfffff0ff | 0x100;
        _i[3] = _i[3] & 0xff0fffff | 0x100000;
      }
      _i = _i + 4;
      roi_cfg = (Vepu540cRoiCfg *)roi_cfg->regions;
    }
  }
  else {
    _mpp_log_l(2,"vepu540c_common","invalid region number %d\n","vepu540c_set_roi",
               (ulong)roi->number);
  }
  return local_44;
}

Assistant:

MPP_RET vepu540c_set_roi(void *roi_reg_base, MppEncROICfg * roi,
                         RK_S32 w, RK_S32 h)
{
    MppEncROIRegion *region = roi->regions;
    Vepu540cRoiCfg  *roi_cfg = (Vepu540cRoiCfg *)roi_reg_base;
    Vepu540cRoiRegion *reg_regions = &roi_cfg->regions[0];
    MPP_RET ret = MPP_NOK;
    RK_S32 i = 0;
    memset(reg_regions, 0, sizeof(Vepu540cRoiRegion) * 8);
    if (NULL == roi_cfg || NULL == roi) {
        mpp_err_f("invalid buf %p roi %p\n", roi_cfg, roi);
        goto DONE;
    }

    if (roi->number > VEPU540C_MAX_ROI_NUM) {
        mpp_err_f("invalid region number %d\n", roi->number);
        goto DONE;
    }

    /* check region config */
    ret = MPP_OK;
    for (i = 0; i < (RK_S32) roi->number; i++, region++) {
        if (region->x + region->w > w || region->y + region->h > h)
            ret = MPP_NOK;

        if (region->intra > 1
            || region->qp_area_idx >= VEPU541_MAX_ROI_NUM
            || region->area_map_en > 1 || region->abs_qp_en > 1)
            ret = MPP_NOK;

        if ((region->abs_qp_en && region->quality > 51) ||
            (!region->abs_qp_en
             && (region->quality > 51 || region->quality < -51)))
            ret = MPP_NOK;

        if (ret) {
            mpp_err_f("region %d invalid param:\n", i);
            mpp_err_f("position [%d:%d:%d:%d] vs [%d:%d]\n",
                      region->x, region->y, region->w, region->h, w,
                      h);
            mpp_err_f("force intra %d qp area index %d\n",
                      region->intra, region->qp_area_idx);
            mpp_err_f("abs qp mode %d value %d\n",
                      region->abs_qp_en, region->quality);
            goto DONE;
        }
        reg_regions->roi_pos_lt.roi_lt_x = MPP_ALIGN(region->x, 16) >> 4;
        reg_regions->roi_pos_lt.roi_lt_y = MPP_ALIGN(region->y, 16) >> 4;
        reg_regions->roi_pos_rb.roi_rb_x = MPP_ALIGN(region->x + region->w, 16) >> 4;
        reg_regions->roi_pos_rb.roi_rb_y = MPP_ALIGN(region->y + region->h, 16) >> 4;
        reg_regions->roi_base.roi_qp_value = region->quality;
        reg_regions->roi_base.roi_qp_adj_mode = region->abs_qp_en;
        reg_regions->roi_base.roi_en = 1;
        reg_regions->roi_base.roi_pri = 0x1f;
        if (region->intra) {
            reg_regions->roi_mdc.roi_mdc_intra16 = 1;
            reg_regions->roi_mdc.roi0_mdc_intra32_hevc = 1;
        }
        reg_regions++;
    }

DONE:
    return ret;
}